

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O0

string_type * __thiscall
booster::locale::impl_std::std_converter<wchar_t>::convert_abi_cxx11_
          (std_converter<wchar_t> *this,conversion_type how,char_type_conflict *begin,
          char_type_conflict *end,int param_5)

{
  ulong uVar1;
  wchar_t *in_RCX;
  int in_EDX;
  long in_RSI;
  string_type *in_RDI;
  long in_R8;
  char_type_conflict *lbegin;
  vector<wchar_t,_std::allocator<wchar_t>_> res;
  size_t len;
  ctype_type *ct;
  wchar_t *in_stack_ffffffffffffff30;
  allocator_type *in_stack_ffffffffffffff38;
  allocator *paVar2;
  wchar_t *in_stack_ffffffffffffff40;
  vector<wchar_t,_std::allocator<wchar_t>_> *this_00;
  size_type in_stack_ffffffffffffff48;
  vector<wchar_t,_std::allocator<wchar_t>_> *in_stack_ffffffffffffff50;
  allocator local_7a;
  allocator local_79;
  vector<wchar_t,_std::allocator<wchar_t>_> *local_78;
  allocator<wchar_t> local_5d;
  undefined4 local_5c;
  vector<wchar_t,_std::allocator<wchar_t>_> local_58;
  ulong local_40;
  ctype *local_38;
  long local_28;
  wchar_t *local_20;
  int local_14;
  
  if (in_EDX - 1U < 3) {
    local_28 = in_R8;
    local_20 = in_RCX;
    local_14 = in_EDX;
    local_38 = std::use_facet<std::ctype<wchar_t>>((locale *)(in_RSI + 0x10));
    local_40 = local_28 - (long)local_20 >> 2;
    local_5c = 0;
    std::allocator<wchar_t>::allocator();
    std::vector<wchar_t,_std::allocator<wchar_t>_>::vector
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
    std::allocator<wchar_t>::~allocator(&local_5d);
    local_78 = (vector<wchar_t,_std::allocator<wchar_t>_> *)
               std::vector<wchar_t,_std::allocator<wchar_t>_>::operator[](&local_58,0);
    std::copy<wchar_t_const*,wchar_t*>
              (in_stack_ffffffffffffff40,(wchar_t *)in_stack_ffffffffffffff38,
               in_stack_ffffffffffffff30);
    if (local_14 == 1) {
      std::__ctype_abstract_base<wchar_t>::toupper
                ((__ctype_abstract_base<wchar_t> *)local_38,(int)local_78);
    }
    else {
      std::__ctype_abstract_base<wchar_t>::tolower
                ((__ctype_abstract_base<wchar_t> *)local_38,(int)local_78);
    }
    paVar2 = &local_79;
    this_00 = local_78;
    uVar1 = local_40;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring((wstring *)in_RDI,(wchar_t *)this_00,uVar1,paVar2);
    std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_79);
    std::vector<wchar_t,_std::allocator<wchar_t>_>::~vector(this_00);
  }
  else {
    uVar1 = in_R8 - (long)in_RCX >> 2;
    paVar2 = &local_7a;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring((wstring *)in_RDI,in_RCX,uVar1,paVar2);
    std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_7a);
  }
  return in_RDI;
}

Assistant:

virtual string_type convert(converter_base::conversion_type how,char_type const *begin,char_type const *end,int /*flags*/ = 0) const 
    {
        switch(how) {
        case converter_base::upper_case:
        case converter_base::lower_case:
        case converter_base::case_folding:
            {
                ctype_type const &ct=std::use_facet<ctype_type>(base_);
                size_t len = end - begin;
                std::vector<char_type> res(len+1,0);
                char_type *lbegin = &res[0];
                std::copy(begin,end,lbegin);
                if(how == converter_base::upper_case)
                    ct.toupper(lbegin,lbegin+len);
                else
                    ct.tolower(lbegin,lbegin+len);
                return string_type(lbegin,len);
            }
        default:
            return string_type(begin,end-begin);
        }
    }